

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O0

void __thiscall Chainstate::CheckForkWarningConditions(Chainstate *this)

{
  long lVar1;
  bool bVar2;
  ChainstateRole CVar3;
  Notifications *pNVar4;
  ConstevalStringLiteral in_RDI;
  long in_FS_OFFSET;
  Level in_stack_00000060;
  char (*in_stack_00000070) [27];
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 uVar5;
  int in_stack_fffffffffffffebc;
  base_uint<256U> *in_stack_fffffffffffffec0;
  Chainstate *in_stack_fffffffffffffec8;
  char *in_stack_fffffffffffffed0;
  base_uint<256U> *in_stack_fffffffffffffed8;
  char *this_00;
  base_uint<256U> *in_stack_fffffffffffffee0;
  bool local_f9;
  LogFlags in_stack_ffffffffffffff20;
  undefined1 local_a8 [8];
  ChainstateManager *in_stack_ffffffffffffff60;
  ConstevalFormatString<1U> in_stack_ffffffffffffff68;
  string_view in_stack_ffffffffffffff70;
  string_view in_stack_ffffffffffffff80;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  AssertLockHeldInternal<AnnotatedMixin<std::recursive_mutex>>
            ((char *)in_stack_fffffffffffffec8,(char *)in_stack_fffffffffffffec0,
             in_stack_fffffffffffffebc,(AnnotatedMixin<std::recursive_mutex> *)0x7ce52a);
  bVar2 = ChainstateManager::IsInitialBlockDownload(in_stack_ffffffffffffff60);
  if ((!bVar2) && (CVar3 = GetRole(in_stack_fffffffffffffec8), CVar3 != BACKGROUND)) {
    local_f9 = false;
    if (*(long *)(*(long *)(in_RDI.lit + 0x50) + 0x18) != 0) {
      CChain::Tip((CChain *)in_stack_fffffffffffffec8);
      CChain::Tip((CChain *)in_stack_fffffffffffffec8);
      GetBlockProof((CBlockIndex *)in_stack_fffffffffffffec8);
      ::operator*(in_stack_fffffffffffffee0,(uint32_t)((ulong)in_stack_fffffffffffffed8 >> 0x20));
      ::operator+(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
      local_f9 = operator>((base_uint<256U> *)in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
    }
    if (local_f9 == false) {
      pNVar4 = ChainstateManager::GetNotifications
                         ((ChainstateManager *)
                          CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
      (*pNVar4->_vptr_Notifications[6])(pNVar4,1);
    }
    else {
      this_00 = "CheckForkWarningConditions";
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)"CheckForkWarningConditions",
                 in_stack_fffffffffffffed0);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)this_00,
                 in_stack_fffffffffffffed0);
      uVar5 = 2;
      LogPrintFormatInternal<char[27]>
                (in_stack_ffffffffffffff80,in_stack_ffffffffffffff70,0,in_stack_ffffffffffffff20,
                 in_stack_00000060,in_stack_ffffffffffffff68,in_stack_00000070);
      pNVar4 = ChainstateManager::GetNotifications
                         ((ChainstateManager *)CONCAT44(in_stack_fffffffffffffebc,uVar5));
      ::_(in_RDI);
      (*pNVar4->_vptr_Notifications[5])(pNVar4,1,local_a8);
      bilingual_str::~bilingual_str((bilingual_str *)CONCAT44(in_stack_fffffffffffffebc,uVar5));
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void Chainstate::CheckForkWarningConditions()
{
    AssertLockHeld(cs_main);

    // Before we get past initial download, we cannot reliably alert about forks
    // (we assume we don't get stuck on a fork before finishing our initial sync)
    // Also not applicable to the background chainstate
    if (m_chainman.IsInitialBlockDownload() || this->GetRole() == ChainstateRole::BACKGROUND) {
        return;
    }

    if (m_chainman.m_best_invalid && m_chainman.m_best_invalid->nChainWork > m_chain.Tip()->nChainWork + (GetBlockProof(*m_chain.Tip()) * 6)) {
        LogPrintf("%s: Warning: Found invalid chain at least ~6 blocks longer than our best chain.\nChain state database corruption likely.\n", __func__);
        m_chainman.GetNotifications().warningSet(
            kernel::Warning::LARGE_WORK_INVALID_CHAIN,
            _("Warning: We do not appear to fully agree with our peers! You may need to upgrade, or other nodes may need to upgrade."));
    } else {
        m_chainman.GetNotifications().warningUnset(kernel::Warning::LARGE_WORK_INVALID_CHAIN);
    }
}